

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

void __thiscall ipx::Maxvolume::Maxvolume(Maxvolume *this,Control *control)

{
  Control *control_local;
  Maxvolume *this_local;
  
  this->control_ = control;
  this->updates_ = 0;
  this->skipped_ = 0;
  this->passes_ = 0;
  this->slices_ = 0;
  this->volinc_ = 0.0;
  this->time_ = 0.0;
  this->tblnnz_ = 0;
  this->tblmax_ = 0.0;
  this->frobnorm_squared_ = 0.0;
  return;
}

Assistant:

Maxvolume::Maxvolume(const Control& control) : control_(control) {}